

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O2

adios2_error
adios2_get_by_name(adios2_engine *engine,char *variable_name,void *data,adios2_mode mode)

{
  string *psVar1;
  undefined4 uVar2;
  Mode MVar3;
  string dataStr;
  allocator local_91;
  allocator local_90 [32];
  string local_70;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&local_50,"for adios2_engine, in call to adios2_get_by_name",
             (allocator *)&dataStr);
  adios2::helper::CheckForNullptr<adios2_engine>(engine,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string
            ((string *)&local_70,"for const char* variable_name, in call to adios2_get_by_name",
             (allocator *)&dataStr);
  adios2::helper::CheckForNullptr<char_const>(variable_name,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string
            ((string *)&dataStr,
             "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get_by_name"
             ,local_90);
  anon_unknown.dwarf_24013::adios2_ToMode(mode,&dataStr);
  std::__cxx11::string::~string((string *)&dataStr);
  psVar1 = *(string **)(engine + 0x28);
  std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
  uVar2 = adios2::core::IO::InquireVariableType(psVar1);
  std::__cxx11::string::~string((string *)&dataStr);
  MVar3 = (Mode)data;
  switch(uVar2) {
  case 1:
    std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
    adios2::core::Engine::Get<signed_char>((string *)engine,(signed *)&dataStr,MVar3);
    break;
  case 2:
    std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
    adios2::core::Engine::Get<short>((string *)engine,(short *)&dataStr,MVar3);
    break;
  case 3:
    std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
    adios2::core::Engine::Get<int>((string *)engine,(int *)&dataStr,MVar3);
    break;
  case 4:
    std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
    adios2::core::Engine::Get<long>((string *)engine,(long *)&dataStr,MVar3);
    break;
  case 5:
    std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
    adios2::core::Engine::Get<unsigned_char>((string *)engine,(uchar *)&dataStr,MVar3);
    break;
  case 6:
    std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
    adios2::core::Engine::Get<unsigned_short>((string *)engine,(ushort *)&dataStr,MVar3);
    break;
  case 7:
    std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
    adios2::core::Engine::Get<unsigned_int>((string *)engine,(uint *)&dataStr,MVar3);
    break;
  case 8:
    std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
    adios2::core::Engine::Get<unsigned_long>((string *)engine,(ulong *)&dataStr,MVar3);
    break;
  case 9:
    std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
    adios2::core::Engine::Get<float>((string *)engine,(float *)&dataStr,MVar3);
    break;
  case 10:
    std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
    adios2::core::Engine::Get<double>((string *)engine,(double *)&dataStr,MVar3);
    break;
  case 0xb:
    std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
    adios2::core::Engine::Get<long_double>((string *)engine,(longdouble *)&dataStr,MVar3);
    break;
  case 0xc:
    std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
    adios2::core::Engine::Get<std::complex<float>>((string *)engine,(complex *)&dataStr,MVar3);
    break;
  case 0xd:
    std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
    adios2::core::Engine::Get<std::complex<double>>((string *)engine,(complex *)&dataStr,MVar3);
    break;
  case 0xe:
    dataStr._M_dataplus._M_p = (pointer)&dataStr.field_2;
    dataStr._M_string_length = 0;
    dataStr.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)local_90,variable_name,&local_91);
    adios2::core::Engine::Get<std::__cxx11::string>
              ((string *)engine,(string *)local_90,(Mode)&dataStr);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::copy((char *)&dataStr,(ulong)data,dataStr._M_string_length);
    break;
  case 0xf:
    std::__cxx11::string::string((string *)&dataStr,variable_name,local_90);
    adios2::core::Engine::Get<char>((string *)engine,(char *)&dataStr,MVar3);
    break;
  default:
    goto switchD_001210e9_default;
  }
  std::__cxx11::string::~string((string *)&dataStr);
switchD_001210e9_default:
  return adios2_error_none;
}

Assistant:

adios2_error adios2_get_by_name(adios2_engine *engine, const char *variable_name, void *data,
                                const adios2_mode mode)
{
    try
    {
        adios2::helper::CheckForNullptr(engine, "for adios2_engine, in call to adios2_get_by_name");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(variable_name, "for const char* variable_name, in call to "
                                                       "adios2_get_by_name");

        const adios2::Mode modeCpp =
            adios2_ToMode(mode, "only adios2_mode_deferred or adios2_mode_sync are valid, "
                                "in call to adios2_get_by_name");
        const adios2::DataType type(engineCpp->m_IO.InquireVariableType(variable_name));

        if (type == adios2::DataType::Struct)
        {
            // not supported
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            std::string dataStr;
            engineCpp->Get(variable_name, dataStr);
            dataStr.copy(reinterpret_cast<char *>(data), dataStr.size());
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        engineCpp->Get(variable_name, reinterpret_cast<T *>(data), modeCpp);                       \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_get_by_name"));
    }
}